

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O1

void __thiscall MeCab::ContextID::add(ContextID *this,char *l,char *r)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator local_69;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_48;
  
  std::__cxx11::string::string((string *)&local_68,l,&local_69);
  paVar1 = &local_48.first.field_2;
  if (local_68 == &local_58) {
    local_48.first.field_2._8_8_ = local_58._8_8_;
    local_48.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_48.first._M_dataplus._M_p = (pointer)local_68;
  }
  local_48.first._M_string_length = local_60;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48.second = 1;
  local_68 = &local_58;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  std::__cxx11::string::string((string *)&local_68,r,&local_69);
  if (local_68 == &local_58) {
    local_48.first.field_2._8_8_ = local_58._8_8_;
    local_48.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_48.first._M_dataplus._M_p = (pointer)local_68;
  }
  local_48.first.field_2._M_allocated_capacity._1_7_ = local_58._M_allocated_capacity._1_7_;
  local_48.first.field_2._M_local_buf[0] = local_58._M_local_buf[0];
  local_48.first._M_string_length = local_60;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48.second = 1;
  local_68 = &local_58;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              *)&this->right_,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void ContextID::add(const char *l, const char *r) {
  left_.insert(std::make_pair(std::string(l), 1));
  right_.insert(std::make_pair(std::string(r), 1));
}